

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

void __thiscall xLearn::OndiskReader::Initialize(OndiskReader *this,string *filename)

{
  Parser *pPVar1;
  char *pcVar2;
  FILE *pFVar3;
  ostream *poVar4;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  if (filename->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&(this->super_Reader).filename_);
    Reader::check_file_format_abi_cxx11_(&local_50,&this->super_Reader);
    pPVar1 = Reader::CreateParser(&this->super_Reader,local_50._M_dataplus._M_p);
    (this->super_Reader).parser_ = pPVar1;
    std::__cxx11::string::~string((string *)&local_50);
    pPVar1 = (this->super_Reader).parser_;
    pPVar1->has_label_ = (this->super_Reader).has_label_;
    std::__cxx11::string::_M_assign((string *)&pPVar1->splitor_);
    pcVar2 = (char *)malloc((this->super_Reader).block_size_ << 0x14);
    (this->super_Reader).block_ = pcVar2;
    pFVar3 = OpenFileOrDie((this->super_Reader).filename_._M_dataplus._M_p,"r");
    this->file_ptr_ = pFVar3;
    return;
  }
  local_54.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.cc"
             ,&local_55);
  std::__cxx11::string::string((string *)&local_30,"Initialize",&local_56);
  poVar4 = Logger::Start(ERR,&local_50,0x120,&local_30);
  poVar4 = std::operator<<(poVar4,"CHECK_NE failed ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.cc"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x120);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"filename.empty()");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"true");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

void OndiskReader::Initialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
  this->filename_ = filename;
  // Init parser_                                 
  parser_ = CreateParser(check_file_format().c_str());
  if (has_label_) parser_->setLabel(true);
  else parser_->setLabel(false);
  // Set splitor
  parser_->setSplitor(this->splitor_);
  // Allocate memory for block
  try {
    this->block_ = (char*)malloc(block_size_*1024*1024);
  } catch (std::bad_alloc&) {
    LOG(FATAL) << "Cannot allocate enough memory for data  \
                   block. Block size: " 
               << block_size_ << "MB. "
               << "You set change the block size via configuration.";
  }
  // Open file
#ifndef _MSC_VER
  file_ptr_ = OpenFileOrDie(filename_.c_str(), "r");
#else
  file_ptr_ = OpenFileOrDie(filename_.c_str(), "rb");
#endif
}